

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O2

tuple<int,_int> __thiscall
libtorrent::http_parser::incoming(http_parser *this,span<const_char> recv_buffer,bool *error)

{
  bool *pbVar1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  _Alloc_hider _Var6;
  bool bVar7;
  char cVar8;
  char cVar9;
  anon_enum_32 aVar10;
  int iVar11;
  bool *pbVar12;
  bool *pbVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  size_type sVar17;
  int iVar18;
  http_parser *this_00;
  int64_t iVar19;
  char *in_R8;
  long lVar20;
  int iVar21;
  _Alloc_hider __nptr;
  int iVar22;
  bool *pbVar23;
  char *pcVar24;
  span<const_char> buf;
  bool *local_128;
  char *line;
  ulong local_f8;
  char local_f0 [16];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  string name;
  string value;
  char *end;
  char *local_68;
  
  pcVar16 = (char *)recv_buffer.m_len;
  this_00 = (http_parser *)recv_buffer.m_ptr;
  this->m_recv_pos = 0;
  local_128 = (bool *)(this_00->m_recv_buffer).m_len;
  if (local_128 == error) {
    return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
  }
  (this_00->m_recv_buffer).m_ptr = pcVar16;
  (this_00->m_recv_buffer).m_len = (difference_type)error;
  aVar10 = this_00->m_state;
  if (aVar10 == error_state) {
    *in_R8 = '\x01';
    return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
  }
  pbVar23 = (bool *)(pcVar16 + this_00->m_recv_pos);
  pbVar1 = error + (long)pcVar16;
  local_d8 = &this_00->m_protocol;
  local_e0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&this_00->m_header;
  pcVar15 = in_R8;
  do {
    if (aVar10 != read_header) {
      pbVar12 = pbVar23;
      if (aVar10 != read_status) goto LAB_001cc83b;
      end = (char *)CONCAT71(end._1_7_,10);
      pbVar12 = (bool *)std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (pbVar23,pbVar1,&end);
      if (pbVar12 == pbVar1) {
        *(int *)&this->m_recv_pos =
             (int)this->m_recv_pos + ((int)(this_00->m_recv_buffer).m_len - (int)local_128);
        return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
      }
      if (pbVar12 == pbVar23) {
        this_00->m_state = error_state;
        *in_R8 = '\x01';
        return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
      }
      pbVar13 = pbVar12 + -1;
      if (pbVar12[-1] != true) {
        pbVar13 = pbVar12;
      }
      pbVar12 = pbVar12 + 1;
      this_00->m_recv_pos = this_00->m_recv_pos + (long)((int)pbVar12 - (int)pbVar23);
      *(int *)&this->m_recv_pos =
           (int)this->m_recv_pos +
           ((int)pbVar12 - ((int)local_128 + *(int *)&(this_00->m_recv_buffer).m_ptr));
      cVar9 = (char)pbVar13;
      line = pbVar23;
      read_until_abi_cxx11_((string *)&end,(libtorrent *)&line,(char **)0x20,cVar9,pcVar15);
      __lhs = local_d8;
      std::__cxx11::string::operator=((string *)local_d8,(string *)&end);
      std::__cxx11::string::~string((string *)&end);
      std::__cxx11::string::substr((ulong)&end,(ulong)__lhs);
      bVar7 = std::operator==((string *)&end,"HTTP/");
      std::__cxx11::string::~string((string *)&end);
      if (bVar7) {
        read_until_abi_cxx11_((string *)&end,(libtorrent *)&line,(char **)0x20,cVar9,pcVar15);
        iVar11 = atoi(end);
        this_00->m_status_code = iVar11;
        std::__cxx11::string::~string((string *)&end);
        read_until_abi_cxx11_((string *)&end,(libtorrent *)&line,(char **)0xd,cVar9,pcVar15);
        std::__cxx11::string::operator=((string *)&this_00->m_server_message,(string *)&end);
        std::__cxx11::string::~string((string *)&end);
        bVar7 = std::operator==(__lhs,"HTTP/1.0");
        if (bVar7) {
          this_00->m_connection_close = true;
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&this_00->m_method);
        pcVar3 = (this_00->m_method)._M_dataplus._M_p;
        sVar4 = (this_00->m_method)._M_string_length;
        for (sVar17 = 0; sVar4 != sVar17; sVar17 = sVar17 + 1) {
          cVar8 = to_lower(pcVar3[sVar17]);
          pcVar3[sVar17] = cVar8;
        }
        this_00->m_content_length = 0;
        (this_00->m_protocol)._M_string_length = 0;
        *(this_00->m_protocol)._M_dataplus._M_p = '\0';
        read_until_abi_cxx11_((string *)&end,(libtorrent *)&line,(char **)0x20,cVar9,pcVar15);
        std::__cxx11::string::operator=((string *)&this_00->m_path,(string *)&end);
        std::__cxx11::string::~string((string *)&end);
        read_until_abi_cxx11_((string *)&end,(libtorrent *)&line,(char **)0x20,cVar9,pcVar15);
        std::__cxx11::string::operator=((string *)local_d8,(string *)&end);
        std::__cxx11::string::~string((string *)&end);
        this_00->m_status_code = 0;
      }
      this_00->m_state = read_header;
      local_128 = pbVar12 + -(long)pcVar16;
      pbVar23 = pbVar12;
    }
    end = (char *)CONCAT71(end._1_7_,10);
    pbVar13 = (bool *)std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pbVar23,pbVar1,&end);
    line = local_f0;
    local_f8 = 0;
    local_f0[0] = '\0';
    pbVar12 = pbVar23;
    while( true ) {
      if ((pbVar13 == pbVar1) || (this_00->m_state != read_header)) goto LAB_001cc808;
      pbVar23 = pbVar13;
      if ((pbVar12 != pbVar13) && (pbVar23 = pbVar13 + -1, pbVar13[-1] != true)) {
        pbVar23 = pbVar13;
      }
      std::__cxx11::string::assign<char_const*,void>((string *)&line,pbVar12,pbVar23);
      pbVar23 = pbVar13 + 1;
      this_00->m_recv_pos = (int64_t)(pbVar23 + (this_00->m_recv_pos - (long)pbVar12));
      uVar14 = std::__cxx11::string::find('\0',0x3a);
      pbVar12 = pbVar23;
      if (uVar14 == 0xffffffffffffffff) break;
      std::__cxx11::string::substr((ulong)&name,(ulong)&line);
      sVar4 = name._M_string_length;
      lVar20 = CONCAT44(name._M_dataplus._M_p._4_4_,(int)name._M_dataplus._M_p);
      for (sVar17 = 0; sVar4 != sVar17; sVar17 = sVar17 + 1) {
        cVar9 = to_lower(*(char *)(lVar20 + sVar17));
        *(char *)(lVar20 + sVar17) = cVar9;
      }
      do {
        uVar14 = uVar14 + 1;
        if (local_f8 <= uVar14) break;
      } while ((line[uVar14] == ' ') || (line[uVar14] == '\t'));
      std::__cxx11::string::substr((ulong)&value,(ulong)&line);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&end,&name,&value);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                (local_e0,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&end);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&end);
      bVar7 = std::operator==(&name,"content-length");
      if (bVar7) {
        uVar14 = strtoll(value._M_dataplus._M_p,(char **)0x0,10);
        this_00->m_content_length = uVar14;
        if (0x7ffffffffffffffe < uVar14) goto LAB_001cc7c7;
      }
      else {
        bVar7 = std::operator==(&name,"connection");
        if (bVar7) {
          bVar7 = string_begins_no_case("close",value._M_dataplus._M_p);
          this_00->m_connection_close = bVar7;
        }
        else {
          bVar7 = std::operator==(&name,"content-range");
          _Var6 = value._M_dataplus;
          if (bVar7) {
            bVar7 = string_begins_no_case("bytes ",value._M_dataplus._M_p);
            __nptr._M_p = _Var6._M_p + 6;
            if (!bVar7) {
              __nptr = _Var6;
            }
            uVar14 = strtoll(__nptr._M_p,&end,10);
            this_00->m_range_start = uVar14;
            if (((0x7ffffffffffffffe < uVar14) || (end == __nptr._M_p)) || (*end != '-')) {
LAB_001cc7c7:
              this_00->m_state = error_state;
              *in_R8 = '\x01';
              std::__cxx11::string::~string((string *)&value);
              std::__cxx11::string::~string((string *)&name);
              std::__cxx11::string::~string((string *)&line);
              return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
            }
            pcVar24 = end + 1;
            uVar14 = strtoll(pcVar24,&end,10);
            this_00->m_range_end = uVar14;
            if (((0x7ffffffffffffffe < uVar14) || (end == pcVar24)) ||
               ((long)uVar14 < this_00->m_range_start)) goto LAB_001cc7c7;
            this_00->m_content_length = (uVar14 - this_00->m_range_start) + 1;
          }
          else {
            bVar7 = std::operator==(&name,"transfer-encoding");
            if (bVar7) {
              bVar7 = string_begins_no_case("chunked",value._M_dataplus._M_p);
              this_00->m_chunked_encoding = bVar7;
            }
          }
        }
      }
      end = (char *)CONCAT71(end._1_7_,10);
      pbVar13 = (bool *)std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (pbVar23,pbVar1,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&end);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&name);
    }
    if (this_00->m_status_code != 100) break;
    this_00->m_state = read_status;
    std::__cxx11::string::~string((string *)&line);
    aVar10 = this_00->m_state;
  } while( true );
  this_00->m_state = read_body;
  this_00->m_body_start_pos = (int)this_00->m_recv_pos;
  pbVar13 = pbVar23;
LAB_001cc808:
  *(int *)&this->m_recv_pos =
       (int)this->m_recv_pos +
       ((int)pbVar13 - ((int)local_128 + *(int *)&(this_00->m_recv_buffer).m_ptr));
  std::__cxx11::string::~string((string *)&line);
  aVar10 = this_00->m_state;
LAB_001cc83b:
  if (aVar10 != read_body) {
    return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
  }
  uVar14 = (long)pbVar1 - (long)pbVar12;
  if ((this_00->m_chunked_encoding == true) && ((this_00->m_flags & 1) == 0)) {
    pcVar15 = (char *)this_00->m_cur_chunk_end;
    if (pcVar15 == (char *)0xffffffffffffffff) {
      pcVar15 = (char *)(long)this_00->m_body_start_pos;
      this_00->m_cur_chunk_end = (int64_t)pcVar15;
    }
    iVar22 = (int)this->m_recv_pos;
    iVar11 = *(int *)((long)&this->m_recv_pos + 4);
    local_e0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this_00->m_chunked_ranges;
    iVar19 = this_00->m_recv_pos;
    while( true ) {
      iVar21 = (int)uVar14;
      lVar20 = iVar21 + iVar19;
      if (((lVar20 < (long)pcVar15) || (iVar21 < 1)) || (this_00->m_finished != false)) break;
      if ((long)pcVar15 - iVar19 != 0 && iVar19 <= (long)pcVar15) {
        this_00->m_recv_pos = (int64_t)pcVar15;
        iVar18 = (int)((long)pcVar15 - iVar19);
        iVar11 = iVar11 + iVar18;
        iVar21 = iVar21 - iVar18;
      }
      buf.m_len = (long)error - (long)pcVar15;
      buf.m_ptr = pcVar15 + (long)pcVar16;
      bVar7 = parse_chunk_header(this_00,buf,(int64_t *)&line,(int *)&name);
      iVar18 = (int)name._M_dataplus._M_p;
      pcVar24 = line;
      if (bVar7) {
        if ((long)line < 0) {
LAB_001ccaac:
          *(int *)((long)&this->m_recv_pos + 4) = iVar11;
          *(int *)&this->m_recv_pos = iVar22;
          this_00->m_state = error_state;
          *in_R8 = '\x01';
          return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
        }
        lVar20 = (long)(int)name._M_dataplus._M_p;
        pcVar15 = (char *)(this_00->m_cur_chunk_end + lVar20);
        if (0x7fffffffffffffff - (long)pcVar15 < (long)line) goto LAB_001ccaac;
        if (line == (char *)0x0) {
          this_00->m_cur_chunk_end = (int64_t)pcVar15;
          this_00->m_finished = true;
        }
        else {
          local_68 = pcVar15 + (long)line;
          end = pcVar15;
          std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
                    ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                     local_e0,(value_type *)&end);
          pcVar15 = pcVar24 + this_00->m_cur_chunk_end + lVar20;
          this_00->m_cur_chunk_end = (int64_t)pcVar15;
        }
        iVar2 = this_00->m_partial_chunk_header;
        this_00->m_partial_chunk_header = 0;
        iVar18 = iVar18 - iVar2;
      }
      else {
        this_00->m_partial_chunk_header = this_00->m_partial_chunk_header + iVar21;
        pcVar15 = (char *)this_00->m_cur_chunk_end;
        iVar18 = iVar21;
      }
      this_00->m_chunk_header_size = this_00->m_chunk_header_size + iVar18;
      iVar19 = this_00->m_recv_pos + (long)iVar18;
      this_00->m_recv_pos = iVar19;
      iVar22 = iVar22 + iVar18;
      uVar14 = (ulong)(uint)(iVar21 - iVar18);
    }
    *(int *)((long)&this->m_recv_pos + 4) = iVar11;
    *(int *)&this->m_recv_pos = iVar22;
    if (iVar21 < 1) goto LAB_001cca3e;
    this_00->m_recv_pos = lVar20;
    iVar11 = iVar11 + iVar21;
    iVar19 = lVar20;
  }
  else {
    iVar22 = (int)uVar14;
    lVar20 = this_00->m_recv_pos;
    lVar5 = this_00->m_content_length;
    iVar11 = ((int)lVar5 - (int)lVar20) + this_00->m_body_start_pos;
    if ((iVar22 + lVar20) - (long)this_00->m_body_start_pos <= lVar5) {
      iVar11 = iVar22;
    }
    if (lVar5 < 0) {
      iVar11 = iVar22;
    }
    iVar19 = lVar20 + iVar11;
    this_00->m_recv_pos = iVar19;
    iVar11 = iVar11 + *(int *)((long)&this->m_recv_pos + 4);
  }
  *(int *)((long)&this->m_recv_pos + 4) = iVar11;
LAB_001cca3e:
  if (((-1 < this_00->m_content_length) && (this_00->m_chunked_encoding == false)) &&
     (this_00->m_content_length <= iVar19 - this_00->m_body_start_pos)) {
    this_00->m_finished = true;
  }
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> http_parser::incoming(
		span<char const> recv_buffer, bool& error)
	{
		TORRENT_ASSERT(recv_buffer.size() >= m_recv_buffer.size());
		std::tuple<int, int> ret(0, 0);
		std::ptrdiff_t start_pos = m_recv_buffer.size();

		// early exit if there's nothing new in the receive buffer
		if (start_pos == recv_buffer.size()) return ret;
		m_recv_buffer = recv_buffer;

		if (m_state == error_state)
		{
			error = true;
			return ret;
		}

		char const* pos = recv_buffer.data() + m_recv_pos;

restart_response:

		if (m_state == read_status)
		{
			TORRENT_ASSERT(!m_finished);
			TORRENT_ASSERT(pos <= recv_buffer.end());
			char const* newline = std::find(pos, recv_buffer.end(), '\n');
			// if we don't have a full line yet, wait.
			if (newline == recv_buffer.end())
			{
				std::get<1>(ret) += int(m_recv_buffer.size() - start_pos);
				return ret;
			}

			if (newline == pos)
			{
				m_state = error_state;
				error = true;
				return ret;
			}

			char const* line_end = newline;
			if (pos != line_end && *(line_end - 1) == '\r') --line_end;

			char const* line = pos;
			++newline;
			TORRENT_ASSERT(newline >= pos);
			int incoming = int(newline - pos);
			m_recv_pos += incoming;
			std::get<1>(ret) += int(newline - (m_recv_buffer.data() + start_pos));
			pos = newline;

			m_protocol = read_until(line, ' ', line_end);
			if (m_protocol.substr(0, 5) == "HTTP/")
			{
				m_status_code = atoi(read_until(line, ' ', line_end).c_str());
				m_server_message = read_until(line, '\r', line_end);

				// HTTP 1.0 always closes the connection after
				// each request
				if (m_protocol == "HTTP/1.0") m_connection_close = true;
			}
			else
			{
				m_method = m_protocol;
				std::transform(m_method.begin(), m_method.end(), m_method.begin(), &to_lower);
				// the content length is assumed to be 0 for requests
				m_content_length = 0;
				m_protocol.clear();
				m_path = read_until(line, ' ', line_end);
				m_protocol = read_until(line, ' ', line_end);
				m_status_code = 0;
			}
			m_state = read_header;
			start_pos = pos - recv_buffer.data();
		}

		if (m_state == read_header)
		{
			TORRENT_ASSERT(!m_finished);
			TORRENT_ASSERT(pos <= recv_buffer.end());
			char const* newline = std::find(pos, recv_buffer.end(), '\n');
			std::string line;

			while (newline != recv_buffer.end() && m_state == read_header)
			{
				// if the LF character is preceded by a CR
				// character, don't copy it into the line string.
				char const* line_end = newline;
				if (pos != line_end && *(line_end - 1) == '\r') --line_end;
				line.assign(pos, line_end);
				++newline;
				m_recv_pos += newline - pos;
				pos = newline;

				std::string::size_type separator = line.find(':');
				if (separator == std::string::npos)
				{
					if (m_status_code == 100)
					{
						// for 100 Continue, we need to read another response header
						// before reading the body
						m_state = read_status;
						goto restart_response;
					}
					// this means we got a blank line,
					// the header is finished and the body
					// starts.
					m_state = read_body;
					// if this is a request (not a response)
					// we're done once we reach the end of the headers
//					if (!m_method.empty()) m_finished = true;
					// the HTTP header should always be < 2 GB
					TORRENT_ASSERT(m_recv_pos < std::numeric_limits<int>::max());
					m_body_start_pos = int(m_recv_pos);
					break;
				}

				std::string name = line.substr(0, separator);
				std::transform(name.begin(), name.end(), name.begin(), &to_lower);
				++separator;
				// skip whitespace
				while (separator < line.size()
					&& (line[separator] == ' ' || line[separator] == '\t'))
					++separator;
				std::string value = line.substr(separator, std::string::npos);
				m_header.insert(std::make_pair(name, value));

				if (name == "content-length")
				{
					m_content_length = std::strtoll(value.c_str(), nullptr, 10);
					if (m_content_length < 0
						|| m_content_length == std::numeric_limits<std::int64_t>::max())
					{
						m_state = error_state;
						error = true;
						return ret;
					}
				}
				else if (name == "connection")
				{
					m_connection_close = string_begins_no_case("close", value.c_str());
				}
				else if (name == "content-range")
				{
					bool success = true;
					char const* ptr = value.c_str();

					// apparently some web servers do not send the "bytes"
					// in their content-range. Don't treat it as an error
					// if we can't find it, just assume the byte counters
					// start immediately
					if (string_begins_no_case("bytes ", ptr)) ptr += 6;
					char* end;
					m_range_start = std::strtoll(ptr, &end, 10);
					if (m_range_start < 0
						|| m_range_start == std::numeric_limits<std::int64_t>::max())
					{
						m_state = error_state;
						error = true;
						return ret;
					}
					if (end == ptr) success = false;
					else if (*end != '-') success = false;
					else
					{
						ptr = end + 1;
						m_range_end = std::strtoll(ptr, &end, 10);
						if (m_range_end < 0
							|| m_range_end == std::numeric_limits<std::int64_t>::max())
						{
							m_state = error_state;
							error = true;
							return ret;
						}
						if (end == ptr) success = false;
					}

					if (!success || m_range_end < m_range_start)
					{
						m_state = error_state;
						error = true;
						return ret;
					}
					// the http range is inclusive
					m_content_length = m_range_end - m_range_start + 1;
				}
				else if (name == "transfer-encoding")
				{
					m_chunked_encoding = string_begins_no_case("chunked", value.c_str());
				}

				TORRENT_ASSERT(m_recv_pos <= int(recv_buffer.size()));
				TORRENT_ASSERT(pos <= recv_buffer.end());
				newline = std::find(pos, recv_buffer.end(), '\n');
			}
			std::get<1>(ret) += int(newline - (m_recv_buffer.data() + start_pos));
		}

		if (m_state == read_body)
		{
			int incoming = int(recv_buffer.end() - pos);

			if (m_chunked_encoding && (m_flags & dont_parse_chunks) == 0)
			{
				if (m_cur_chunk_end == -1)
					m_cur_chunk_end = m_body_start_pos;

				while (m_cur_chunk_end <= m_recv_pos + incoming && !m_finished && incoming > 0)
				{
					std::int64_t payload = m_cur_chunk_end - m_recv_pos;
					if (payload > 0)
					{
						TORRENT_ASSERT(payload < std::numeric_limits<int>::max());
						m_recv_pos += payload;
						std::get<0>(ret) += int(payload);
						incoming -= int(payload);
					}
					auto const buf = span<char const>(recv_buffer)
						.subspan(aux::numeric_cast<std::ptrdiff_t>(m_cur_chunk_end));
					std::int64_t chunk_size;
					int header_size;
					if (parse_chunk_header(buf, &chunk_size, &header_size))
					{
						if (chunk_size < 0
							|| chunk_size > std::numeric_limits<std::int64_t>::max() - m_cur_chunk_end - header_size)
						{
							m_state = error_state;
							error = true;
							return ret;
						}
						if (chunk_size > 0)
						{
							std::pair<std::int64_t, std::int64_t> chunk_range(m_cur_chunk_end + header_size
								, m_cur_chunk_end + header_size + chunk_size);
							m_chunked_ranges.push_back(chunk_range);
						}
						m_cur_chunk_end += header_size + chunk_size;
						if (chunk_size == 0)
						{
							m_finished = true;
						}
						header_size -= m_partial_chunk_header;
						m_partial_chunk_header = 0;
//						std::fprintf(stderr, "parse_chunk_header(%d, -> %" PRId64 ", -> %d) -> %d\n"
//							"  incoming = %d\n  m_recv_pos = %d\n  m_cur_chunk_end = %" PRId64 "\n"
//							"  content-length = %d\n"
//							, int(buf.size()), chunk_size, header_size, 1, incoming, int(m_recv_pos)
//							, m_cur_chunk_end, int(m_content_length));
					}
					else
					{
						m_partial_chunk_header += incoming;
						header_size = incoming;

//						std::fprintf(stderr, "parse_chunk_header(%d, -> %" PRId64 ", -> %d) -> %d\n"
//							"  incoming = %d\n  m_recv_pos = %d\n  m_cur_chunk_end = %" PRId64 "\n"
//							"  content-length = %d\n"
//							, int(buf.size()), chunk_size, header_size, 0, incoming, int(m_recv_pos)
//							, m_cur_chunk_end, int(m_content_length));
					}
					m_chunk_header_size += header_size;
					m_recv_pos += header_size;
					std::get<1>(ret) += header_size;
					incoming -= header_size;
				}
				if (incoming > 0)
				{
					m_recv_pos += incoming;
					std::get<0>(ret) += incoming;
//					incoming = 0;
				}
			}
			else
			{
				std::int64_t payload_received = m_recv_pos - m_body_start_pos + incoming;
				if (payload_received > m_content_length
					&& m_content_length >= 0)
				{
					TORRENT_ASSERT(m_content_length - m_recv_pos + m_body_start_pos
						< std::numeric_limits<int>::max());
					incoming = int(m_content_length - m_recv_pos + m_body_start_pos);
				}

				TORRENT_ASSERT(incoming >= 0);
				m_recv_pos += incoming;
				std::get<0>(ret) += incoming;
			}

			if (m_content_length >= 0
				&& !m_chunked_encoding
				&& m_recv_pos - m_body_start_pos >= m_content_length)
			{
				m_finished = true;
			}
		}
		return ret;
	}